

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_35::InMemoryFile::truncate(InMemoryFile *this,char *__file,__off_t __length)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this_00;
  Impl *this_01;
  char *pcVar1;
  int extraout_EAX;
  long lVar2;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> local_30;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  this_01 = &(this->impl).value;
  pcVar1 = (char *)(this->impl).value.size;
  local_30.mutex = &this_00->mutex;
  local_30.ptr = this_01;
  if (__file < pcVar1) {
    lVar2 = (*(code *)**(undefined8 **)this_01->clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    memset(__file + (long)(this->impl).value.bytes.ptr,0,(this->impl).value.size - (long)__file);
  }
  else {
    if (__file <= pcVar1) goto LAB_0027eec1;
    lVar2 = (*(code *)**(undefined8 **)this_01->clock)();
    (this->impl).value.lastModified.value.value = lVar2;
    Impl::ensureCapacity(this_01,(size_t)__file);
  }
  (this->impl).value.size = (size_t)__file;
LAB_0027eec1:
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&local_30);
  return extraout_EAX;
}

Assistant:

void truncate(uint64_t newSize) const override {
    auto lock = impl.lockExclusive();
    if (newSize < lock->size) {
      lock->modified();
      memset(lock->bytes.begin() + newSize, 0, lock->size - newSize);
      lock->size = newSize;
    } else if (newSize > lock->size) {
      lock->modified();
      lock->ensureCapacity(newSize);
      lock->size = newSize;
    }
  }